

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O3

int ssl_parse_supported_elliptic_curves(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  mbedtls_ssl_handshake_params *pmVar1;
  ulong uVar2;
  int iVar3;
  mbedtls_ecp_curve_info **ppmVar4;
  mbedtls_ecp_curve_info *pmVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar7 = (ulong)buf[1];
  if ((((buf[1] & 1) == 0) && (lVar6 = (ulong)*buf * 0x100, uVar7 + 2 + lVar6 == len)) &&
     (pmVar1 = ssl->handshake, pmVar1->curves == (mbedtls_ecp_curve_info **)0x0)) {
    uVar2 = lVar6 + uVar7 >> 1;
    uVar9 = 0xb;
    if (uVar2 < 0xb) {
      uVar9 = uVar2;
    }
    uVar9 = uVar9 + 1;
    ppmVar4 = (mbedtls_ecp_curve_info **)calloc(uVar9,8);
    if (ppmVar4 == (mbedtls_ecp_curve_info **)0x0) {
      mbedtls_ssl_send_alert_message(ssl,'\x02','P');
      iVar3 = -0x7f00;
    }
    else {
      pmVar1->curves = ppmVar4;
      if (lVar6 + uVar7 == 0) {
        iVar3 = 0;
      }
      else {
        lVar8 = 0;
        do {
          pmVar5 = mbedtls_ecp_curve_info_from_tls_id
                             (*(ushort *)(buf + lVar8 + 2) << 8 | *(ushort *)(buf + lVar8 + 2) >> 8)
          ;
          if (pmVar5 != (mbedtls_ecp_curve_info *)0x0) {
            *ppmVar4 = pmVar5;
            ppmVar4 = ppmVar4 + 1;
            uVar9 = uVar9 - 1;
          }
          iVar3 = 0;
        } while (((uVar7 - 2) + lVar6 != lVar8) && (lVar8 = lVar8 + 2, 1 < uVar9));
      }
    }
  }
  else {
    mbedtls_ssl_send_alert_message(ssl,'\x02','2');
    iVar3 = -0x7900;
  }
  return iVar3;
}

Assistant:

static int ssl_parse_supported_elliptic_curves( mbedtls_ssl_context *ssl,
                                                const unsigned char *buf,
                                                size_t len )
{
    size_t list_size, our_size;
    const unsigned char *p;
    const mbedtls_ecp_curve_info *curve_info, **curves;

    list_size = ( ( buf[0] << 8 ) | ( buf[1] ) );
    if( list_size + 2 != len ||
        list_size % 2 != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client hello message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
    }

    /* Should never happen unless client duplicates the extension */
    if( ssl->handshake->curves != NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client hello message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
    }

    /* Don't allow our peer to make us allocate too much memory,
     * and leave room for a final 0 */
    our_size = list_size / 2 + 1;
    if( our_size > MBEDTLS_ECP_DP_MAX )
        our_size = MBEDTLS_ECP_DP_MAX;

    if( ( curves = mbedtls_calloc( our_size, sizeof( *curves ) ) ) == NULL )
    {
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_INTERNAL_ERROR );
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    ssl->handshake->curves = curves;

    p = buf + 2;
    while( list_size > 0 && our_size > 1 )
    {
        curve_info = mbedtls_ecp_curve_info_from_tls_id( ( p[0] << 8 ) | p[1] );

        if( curve_info != NULL )
        {
            *curves++ = curve_info;
            our_size--;
        }

        list_size -= 2;
        p += 2;
    }

    return( 0 );
}